

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

mcpl_buffer_t * mcpl_internal_buf_create(size_t capacity)

{
  char *pcVar1;
  size_t in_RSI;
  mcpl_buffer_t *in_RDI;
  mcpl_buffer_t *pmVar2;
  
  in_RDI->size = 0;
  pmVar2 = in_RDI;
  if (in_RSI == 0) {
    in_RDI->buf = (char *)0x0;
    in_RDI->capacity = 0;
  }
  else {
    pcVar1 = mcpl_internal_malloc((size_t)in_RDI);
    in_RDI->buf = pcVar1;
    in_RDI->capacity = in_RSI;
  }
  return pmVar2;
}

Assistant:

MCPL_LOCAL mcpl_buffer_t mcpl_internal_buf_create( size_t capacity )
{
  mcpl_buffer_t res;
  res.size = 0;
  if ( capacity == 0 ) {
    res.buf = NULL;
    res.capacity = 0;
  } else {
    res.buf = mcpl_internal_malloc(capacity);
    res.capacity = capacity;
  }
  return res;
}